

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void P_RecalculateAttached3DFloors(sector_t_conflict *sec)

{
  extsector_t *peVar1;
  uint uVar2;
  sector_t_conflict **ppsVar3;
  uint local_1c;
  uint i;
  xfloor *x;
  sector_t_conflict *sec_local;
  
  peVar1 = sec->e;
  local_1c = 0;
  while( true ) {
    uVar2 = TArray<sector_t_*,_sector_t_*>::Size(&(peVar1->XFloor).attached);
    if (uVar2 <= local_1c) break;
    ppsVar3 = TArray<sector_t_*,_sector_t_*>::operator[](&(peVar1->XFloor).attached,(ulong)local_1c)
    ;
    P_Recalculate3DFloors(*ppsVar3);
    local_1c = local_1c + 1;
  }
  P_Recalculate3DFloors(sec);
  return;
}

Assistant:

void P_RecalculateAttached3DFloors(sector_t * sec)
{
	extsector_t::xfloor &x = sec->e->XFloor;

	for(unsigned int i=0; i<x.attached.Size(); i++)
	{
		P_Recalculate3DFloors(x.attached[i]);
	}
	P_Recalculate3DFloors(sec);
}